

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O0

char * macroNameForOp(ComparisonOperation op)

{
  ComparisonOperation op_local;
  char *local_8;
  
  switch(op) {
  case CustomCompare:
    local_8 = "QCOMPARE";
    break;
  case Equal:
    local_8 = "QCOMPARE_EQ";
    break;
  case NotEqual:
    local_8 = "QCOMPARE_NE";
    break;
  case LessThan:
    local_8 = "QCOMPARE_LT";
    break;
  case LessThanOrEqual:
    local_8 = "QCOMPARE_LE";
    break;
  case GreaterThan:
    local_8 = "QCOMPARE_GT";
    break;
  case GreaterThanOrEqual:
    local_8 = "QCOMPARE_GE";
    break;
  case ThreeWayCompare:
    local_8 = "QCOMPARE_3WAY";
  }
  return local_8;
}

Assistant:

static const char *macroNameForOp(QTest::ComparisonOperation op)
{
    using namespace QTest;
    switch (op) {
    case ComparisonOperation::CustomCompare:
        return "QCOMPARE"; /* not used */
    case ComparisonOperation::Equal:
        return "QCOMPARE_EQ";
    case ComparisonOperation::NotEqual:
        return "QCOMPARE_NE";
    case ComparisonOperation::LessThan:
        return "QCOMPARE_LT";
    case ComparisonOperation::LessThanOrEqual:
        return "QCOMPARE_LE";
    case ComparisonOperation::GreaterThan:
        return "QCOMPARE_GT";
    case ComparisonOperation::GreaterThanOrEqual:
        return "QCOMPARE_GE";
    case ComparisonOperation::ThreeWayCompare:
        return "QCOMPARE_3WAY";
    }
    Q_UNREACHABLE_RETURN("");
}